

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O1

void __thiscall ON_Mesh::ON_Mesh(ON_Mesh *this)

{
  double *pdVar1;
  ON__UINT8 *pOVar2;
  undefined8 uVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  long lVar9;
  
  ON_Object::ON_Object((ON_Object *)this);
  (this->super_ON_Geometry).super_ON_Object._vptr_ON_Object = (_func_int **)&PTR_ClassId_00822ab8;
  ON_3dPointArray::ON_3dPointArray(&this->m_dV);
  ON_3fPointArray::ON_3fPointArray(&this->m_V);
  (this->m_F)._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_00822ff8;
  (this->m_F).m_a = (ON_MeshFace *)0x0;
  (this->m_F).m_count = 0;
  (this->m_F).m_capacity = 0;
  (this->m_NgonMap)._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0081c860;
  (this->m_NgonMap).m_a = (uint *)0x0;
  (this->m_NgonMap).m_count = 0;
  (this->m_NgonMap).m_capacity = 0;
  (this->m_Ngon)._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_00823038;
  (this->m_Ngon).m_a = (ON_MeshNgon **)0x0;
  (this->m_Ngon).m_count = 0;
  (this->m_Ngon).m_capacity = 0;
  ON_MeshNgonAllocator::ON_MeshNgonAllocator(&this->m_NgonAllocator);
  ON_3fVectorArray::ON_3fVectorArray(&this->m_N);
  ON_3fVectorArray::ON_3fVectorArray(&this->m_FN);
  ON_MappingTag::ON_MappingTag(&this->m_Ttag);
  ON_2fPointArray::ON_2fPointArray(&this->m_T);
  (this->m_TC)._vptr_ON_ClassArray = (_func_int **)&PTR__ON_ClassArray_00823078;
  (this->m_TC).m_a = (ON_TextureCoordinates *)0x0;
  (this->m_TC).m_count = 0;
  (this->m_TC).m_capacity = 0;
  ON_2dPointArray::ON_2dPointArray(&this->m_S);
  lVar9 = 0x240;
  do {
    ON_Interval::ON_Interval
              ((ON_Interval *)
               ((long)&(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object + lVar9));
    lVar9 = lVar9 + 0x10;
  } while (lVar9 != 0x260);
  lVar9 = 0x270;
  do {
    ON_Interval::ON_Interval
              ((ON_Interval *)
               ((long)&(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object + lVar9));
    lVar9 = lVar9 + 0x10;
  } while (lVar9 != 0x290);
  this->m_packed_tex_rotate = false;
  (this->m_K)._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_008230c0;
  (this->m_K).m_a = (ON_SurfaceCurvature *)0x0;
  (this->m_K).m_count = 0;
  (this->m_K).m_capacity = 0;
  ON_MappingTag::ON_MappingTag(&this->m_Ctag);
  (this->m_C)._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_00823100;
  (this->m_C).m_a = (ON_Color *)0x0;
  (this->m_C).m_count = 0;
  (this->m_C).m_capacity = 0;
  (this->m_H)._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_008189b0;
  (this->m_H).m_a = (bool *)0x0;
  (this->m_H).m_count = 0;
  (this->m_H).m_capacity = 0;
  this->m_parent = (ON_Object *)0x0;
  ON_MeshTopology::ON_MeshTopology(&this->m_top);
  this->m_mesh_parameters = (ON_MeshParameters *)0x0;
  this->m_invalid_count = 0;
  this->m_quad_count = 0;
  this->m_triangle_count = 0;
  dVar8 = ON_BoundingBox::UnsetBoundingBox.m_max.z;
  dVar7 = ON_BoundingBox::UnsetBoundingBox.m_max.y;
  dVar6 = ON_BoundingBox::UnsetBoundingBox.m_max.x;
  dVar5 = ON_BoundingBox::UnsetBoundingBox.m_min.z;
  dVar4 = ON_BoundingBox::UnsetBoundingBox.m_min.y;
  this->m_mesh_is_closed = '\0';
  this->m_mesh_is_manifold = '\0';
  this->m_mesh_is_oriented = '\0';
  this->m_mesh_is_solid = '\0';
  (this->m_vertex_bbox).m_min.x = ON_BoundingBox::UnsetBoundingBox.m_min.x;
  (this->m_vertex_bbox).m_min.y = dVar4;
  (this->m_vertex_bbox).m_min.z = dVar5;
  (this->m_vertex_bbox).m_max.x = dVar6;
  (this->m_vertex_bbox).m_max.y = dVar7;
  (this->m_vertex_bbox).m_max.z = dVar8;
  (this->m_tight_bbox_cache).m_count = 0;
  (this->m_tight_bbox_cache).m_capacity = 0;
  lVar9 = 0x478;
  do {
    dVar8 = ON_BoundingBox::UnsetBoundingBox.m_max.z;
    dVar7 = ON_BoundingBox::UnsetBoundingBox.m_max.x;
    dVar6 = ON_BoundingBox::UnsetBoundingBox.m_min.z;
    dVar5 = ON_BoundingBox::UnsetBoundingBox.m_min.y;
    dVar4 = ON_BoundingBox::UnsetBoundingBox.m_min.x;
    pdVar1 = (double *)((long)&(this->m_dV).super_ON_SimpleArray<ON_3dPoint>.m_count + lVar9);
    *pdVar1 = ON_BoundingBox::UnsetBoundingBox.m_max.y;
    pdVar1[1] = dVar8;
    pdVar1 = (double *)
             ((long)&(this->m_dV).super_ON_SimpleArray<ON_3dPoint>._vptr_ON_SimpleArray + lVar9);
    *pdVar1 = dVar6;
    pdVar1[1] = dVar7;
    pdVar1 = (double *)((long)&(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object + lVar9);
    *pdVar1 = dVar4;
    pdVar1[1] = dVar5;
    uVar3 = ON_SHA1_Hash::EmptyContentHash.m_digest._8_8_;
    pOVar2 = (ON__UINT8 *)((long)&(this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_a + lVar9);
    *(undefined8 *)pOVar2 = ON_SHA1_Hash::EmptyContentHash.m_digest._0_8_;
    *(undefined8 *)(pOVar2 + 8) = uVar3;
    *(undefined4 *)((long)&(this->m_F)._vptr_ON_SimpleArray + lVar9) =
         ON_SHA1_Hash::EmptyContentHash.m_digest._16_4_;
    lVar9 = lVar9 + 0x48;
  } while (lVar9 != 0x6b8);
  (this->m_top).m_mesh = this;
  this->m_srf_scale[0] = 0.0;
  this->m_srf_scale[1] = 0.0;
  this->m_kstat[0] = (ON_MeshCurvatureStats *)0x0;
  this->m_kstat[1] = (ON_MeshCurvatureStats *)0x0;
  this->m_kstat[2] = (ON_MeshCurvatureStats *)0x0;
  this->m_kstat[3] = (ON_MeshCurvatureStats *)0x0;
  InvalidateBoundingBoxes(this);
  this->m_partition = (ON_MeshPartition *)0x0;
  this->m_hidden_count = 0;
  return;
}

Assistant:

ON_Mesh::ON_Mesh() 
: m_packed_tex_rotate(0)
, m_parent(0)
, m_mesh_parameters(0) 
, m_invalid_count(0) 
, m_quad_count(0) 
, m_triangle_count(0)
, m_mesh_is_closed(0)
, m_mesh_is_manifold(0)
, m_mesh_is_oriented(0)
, m_mesh_is_solid(0)
{
  m_top.m_mesh = this;
  m_srf_scale[0] = 0.0;
  m_srf_scale[1] = 0.0;
  m_kstat[0] = 0;
  m_kstat[1] = 0;
  m_kstat[2] = 0;
  m_kstat[3] = 0;
  InvalidateBoundingBoxes();
  m_partition = 0;
  m_hidden_count = 0;
}